

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O1

void add_pax_attr_time(archive_string *as,char *key,int64_t sec,unsigned_long nanos)

{
  bool bVar1;
  size_t value_len;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  char *__s;
  char tmp [50];
  char acStack_29 [17];
  
  pcVar5 = acStack_29 + 2;
  acStack_29[2] = 0;
  uVar4 = 0xb;
  do {
    uVar4 = uVar4 - 1;
    uVar3 = nanos / 10;
    uVar2 = nanos % 10;
    if (uVar4 < 2) break;
    nanos = uVar3;
  } while (uVar2 == 0);
  if (1 < uVar4) {
    pcVar5 = acStack_29 + 1;
    do {
      *pcVar5 = "0123456789"[uVar2];
      uVar2 = uVar3 % 10;
      pcVar5 = pcVar5 + -1;
      uVar4 = uVar4 - 1;
      uVar3 = uVar3 / 10;
    } while (1 < (int)uVar4);
    *pcVar5 = '.';
  }
  uVar3 = -sec;
  if (0 < sec) {
    uVar3 = sec;
  }
  pcVar5 = pcVar5 + -1;
  do {
    __s = pcVar5;
    *__s = "0123456789"[uVar3 % 10];
    pcVar5 = __s + -1;
    bVar1 = 9 < uVar3;
    uVar3 = uVar3 / 10;
  } while (bVar1);
  if (sec < 0) {
    *pcVar5 = '-';
    __s = pcVar5;
  }
  value_len = strlen(__s);
  add_pax_attr_binary(as,key,__s,value_len);
  return;
}

Assistant:

static void
add_pax_attr_time(struct archive_string *as, const char *key,
    int64_t sec, unsigned long nanos)
{
	int digit, i;
	char *t;
	/*
	 * Note that each byte contributes fewer than 3 base-10
	 * digits, so this will always be big enough.
	 */
	char tmp[1 + 3*sizeof(sec) + 1 + 3*sizeof(nanos)];

	tmp[sizeof(tmp) - 1] = 0;
	t = tmp + sizeof(tmp) - 1;

	/* Skip trailing zeros in the fractional part. */
	for (digit = 0, i = 10; i > 0 && digit == 0; i--) {
		digit = nanos % 10;
		nanos /= 10;
	}

	/* Only format the fraction if it's non-zero. */
	if (i > 0) {
		while (i > 0) {
			*--t = "0123456789"[digit];
			digit = nanos % 10;
			nanos /= 10;
			i--;
		}
		*--t = '.';
	}
	t = format_int(t, sec);

	add_pax_attr(as, key, t);
}